

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.hpp
# Opt level: O3

tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool> * __thiscall
pstore::command_line::details::process_single_dash<std::__cxx11::ostringstream>
          (tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool> *__return_storage_ptr__,
          details *this,string *arg_name,string *program_name,
          basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *errs)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  size_t sVar4;
  option **ppoVar5;
  type *ptVar6;
  byte bVar7;
  char name [2];
  maybe<pstore::command_line::option_*,_void> handler;
  char local_b2 [2];
  tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool> *local_b0;
  maybe<pstore::command_line::option_*,_void> local_a8;
  maybe<pstore::command_line::option_*,_void> local_98;
  undefined1 local_88 [24];
  undefined1 auStack_70 [16];
  string local_60;
  string *local_40;
  string *local_38;
  
  bVar1 = starts_with((string *)this,"-");
  if (!bVar1) {
    assert_failed("starts_with (arg_name, \"-\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/command_line/command_line.hpp"
                  ,0xc5);
  }
  std::__cxx11::string::erase((ulong)this,0);
  local_a8._0_8_ = 0;
  local_a8.storage_ = (type)0x0;
  bVar1 = true;
  bVar7 = 0;
  if (*(long *)(this + 8) != 0) {
    local_b0 = __return_storage_ptr__;
    local_40 = arg_name;
    local_38 = program_name;
    do {
      local_b2[0] = **(char **)this;
      local_b2[1] = 0;
      local_88._0_8_ = local_88 + 0x10;
      sVar4 = strlen(local_b2);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_88,local_b2,local_b2 + sVar4);
      find_handler((maybe<pstore::command_line::option_*,_void> *)&local_60,(string *)local_88);
      maybe<pstore::command_line::option_*,_void>::operator=
                (&local_a8,(maybe<pstore::command_line::option_*,_void> *)&local_60);
      if ((char)local_60._M_dataplus._M_p == '\x01') {
        local_60._M_dataplus._M_p = local_60._M_dataplus._M_p & 0xffffffffffffff00;
      }
      if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
        operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
      }
      if (local_a8.valid_ != true) {
LAB_0012e251:
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        sVar4 = strlen(local_b2);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,local_b2,local_b2 + sVar4);
        local_88._16_8_ = 0;
        auStack_70._0_8_ = 0;
        local_88._0_8_ = (pointer)0x0;
        local_88._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_70._8_8_ = 0;
        report_unknown_option<std::__cxx11::ostringstream>
                  (local_40,&local_60,
                   (maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                    *)local_88,
                   (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_38);
        if (local_88[0] == true) {
          local_88._0_8_ = local_88._0_8_ & 0xffffffffffffff00;
          if ((undefined1 *)local_88._8_8_ != auStack_70) {
            operator_delete((void *)local_88._8_8_,auStack_70._0_8_ + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        bVar1 = false;
LAB_0012e2e9:
        __return_storage_ptr__ = local_b0;
        bVar7 = local_a8.valid_;
        goto LAB_0012e2fb;
      }
      ppoVar5 = maybe<pstore::command_line::option_*,_void>::operator->(&local_a8);
      iVar3 = (*(*ppoVar5)->_vptr_option[9])();
      if ((char)iVar3 != '\0') goto LAB_0012e251;
      ppoVar5 = maybe<pstore::command_line::option_*,_void>::operator->(&local_a8);
      iVar3 = (*(*ppoVar5)->_vptr_option[0xe])();
      std::__cxx11::string::erase((ulong)this,0);
      if ((char)iVar3 != '\0') {
        if (*(long *)(this + 8) != 0) {
          local_98.valid_ = false;
          bVar1 = local_a8.valid_ == true;
          if (bVar1) {
            ptVar6 = (type *)maybe<pstore::command_line::option_*,_void>::operator->(&local_a8);
            local_98.storage_ = *ptVar6;
          }
          local_98.valid_ = bVar1;
          cVar2 = handler_set_value(&local_98,(string *)this);
          if (local_98.valid_ == true) {
            local_98.valid_ = false;
          }
          *(undefined8 *)(this + 8) = 0;
          **(undefined1 **)this = 0;
          goto LAB_0012e221;
        }
        bVar1 = true;
        goto LAB_0012e2e9;
      }
      ppoVar5 = maybe<pstore::command_line::option_*,_void>::operator->(&local_a8);
      iVar3 = (*(*ppoVar5)->_vptr_option[0x10])();
      cVar2 = (char)iVar3;
LAB_0012e221:
      bVar7 = local_a8.valid_;
      if (local_a8.valid_ == true) {
        local_a8._0_8_ = local_a8._0_8_ & 0xffffffffffffff00;
        bVar7 = 0;
      }
      __return_storage_ptr__ = local_b0;
      if (cVar2 == '\0') {
        bVar1 = false;
        goto LAB_0012e2fb;
      }
    } while (*(long *)(this + 8) != 0);
    bVar1 = true;
  }
LAB_0012e2fb:
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_pstore::maybe<pstore::command_line::option_*,_void>,_bool>).
  super__Tuple_impl<1UL,_bool>.super__Head_base<1UL,_bool,_false>._M_head_impl = bVar1;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_pstore::maybe<pstore::command_line::option_*,_void>,_bool>).
  super__Head_base<0UL,_pstore::maybe<pstore::command_line::option_*,_void>,_false>._M_head_impl.
  valid_ = false;
  if ((bVar7 & 1) != 0) {
    ptVar6 = (type *)maybe<pstore::command_line::option_*,_void>::operator->(&local_a8);
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_pstore::maybe<pstore::command_line::option_*,_void>,_bool>).
    super__Head_base<0UL,_pstore::maybe<pstore::command_line::option_*,_void>,_false>._M_head_impl.
    storage_ = *ptVar6;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_pstore::maybe<pstore::command_line::option_*,_void>,_bool>).
    super__Head_base<0UL,_pstore::maybe<pstore::command_line::option_*,_void>,_false>._M_head_impl.
    valid_ = true;
  }
  return __return_storage_ptr__;
}

Assistant:

std::tuple<maybe<option *>, bool> process_single_dash (std::string arg_name,
                                                                   std::string const & program_name,
                                                                   ErrorStream & errs) {
                PSTORE_ASSERT (starts_with (arg_name, "-"));
                arg_name.erase (0, 1U); // Remove the leading dash.

                auto handler = nothing<option *> ();
                sticky_bool<false> ok{true};
                while (ok && !arg_name.empty ()) {
                    char const name[2]{arg_name[0], '\0'};
                    handler = find_handler (name);
                    if (!handler || (*handler)->is_positional ()) {
                        report_unknown_option (program_name, name, nothing<std::string> (), errs);
                        ok = false;
                        break;
                    }

                    if ((*handler)->takes_argument ()) {
                        arg_name.erase (0, 1U);
                        if (arg_name.length () == 0U) {
                            // No value was supplied immediately after the argument name. It
                            // could be the next argument.
                            break;
                        }
                        ok = handler_set_value (handler, arg_name);
                        arg_name.clear ();
                    } else {
                        arg_name.erase (0, 1U);
                        ok = (*handler)->add_occurrence ();
                    }
                    handler.reset ();
                }
                return std::make_tuple (std::move (handler), ok.get ());
            }